

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMagic.cpp
# Opt level: O2

void anon_unknown.dwarf_188de1::testFile1(char *fileName,bool isImfFile)

{
  uint __line;
  char cVar1;
  ostream *poVar2;
  char *pcVar3;
  char bytes [4];
  ifstream f;
  char local_208 [16];
  byte abStack_1f8 [488];
  
  poVar2 = std::operator<<((ostream *)&std::cout,fileName);
  std::operator<<(poVar2," ");
  std::ostream::flush();
  std::ifstream::ifstream(&f);
  std::filebuf::open(local_208,(_Ios_Openmode)fileName);
  if ((abStack_1f8[*(long *)(_f + -0x18)] & 5) == 0) {
    std::istream::read((char *)&f,(long)bytes);
    if ((abStack_1f8[*(long *)(_f + -0x18)] & 5) == 0) {
      cVar1 = Imf_3_2::isImfMagic(bytes);
      if ((bool)cVar1 == isImfFile) {
        poVar2 = std::operator<<((ostream *)&std::cout,"is ");
        cVar1 = Imf_3_2::isImfMagic(bytes);
        pcVar3 = "not ";
        if (cVar1 != '\0') {
          pcVar3 = "";
        }
        poVar2 = std::operator<<(poVar2,pcVar3);
        std::operator<<(poVar2,"an OpenEXR file\n");
        std::ifstream::~ifstream(&f);
        return;
      }
    }
    pcVar3 = "!!f && isImfFile == isImfMagic (bytes)";
    __line = 0x2a;
  }
  else {
    pcVar3 = "!!f";
    __line = 0x25;
  }
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMagic.cpp"
                ,__line,"void (anonymous namespace)::testFile1(const char *, bool)");
}

Assistant:

void
testFile1 (const char fileName[], bool isImfFile)
{
    cout << fileName << " " << flush;

    ifstream f;
    testutil::OpenStreamWithUTF8Name (f, fileName, ios::in | ios_base::binary);
    assert (!!f);

    char bytes[4];
    f.read (bytes, sizeof (bytes));

    assert (!!f && isImfFile == isImfMagic (bytes));

    cout << "is " << (isImfMagic (bytes) ? "" : "not ") << "an OpenEXR file\n";
}